

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O2

void __thiscall
ContextTest_StringFormat_Test::ContextTest_StringFormat_Test(ContextTest_StringFormat_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001969b8;
  return;
}

Assistant:

TEST(ContextTest, StringFormat) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").constrain("b");

  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());

  os.str("");
  os << root;
  EXPECT_EQ("<root>", os.str());
}